

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O3

void __thiscall Goal::solve(Goal *this,Program *prog,int level,VarMapping *vars)

{
  Trace *pTVar1;
  ostream *poVar2;
  Clause *this_00;
  Compound *l;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  int iVar3;
  char *dst;
  Program *pPVar4;
  undefined4 extraout_var;
  
  iVar3 = level;
  if (0 < level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solve@",6);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  print(this);
  dst = "\n";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pTVar1 = Trace::history;
  if (prog != (Program *)0x0) {
    src = extraout_RDX;
    pPVar4 = prog;
    do {
      iVar3 = Clause::copy(pPVar4->head,(EVP_PKEY_CTX *)dst,src);
      this_00 = (Clause *)CONCAT44(extraout_var,iVar3);
      for (; Trace::history != pTVar1; Trace::history = Trace::history->tail) {
        Trace::history->head->instance = &Trace::history->head->super_Term;
      }
      iVar3 = level;
      if (0 < level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  try:",6);
      Clause::print(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      dst = (char *)this_00->head;
      iVar3 = (*(this->head->super_Term)._vptr_Term[1])();
      if ((char)iVar3 == '\0') {
        iVar3 = level;
        if (0 < level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        dst = "  nomatch.\n";
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  nomatch.\n",0xb)
        ;
        src = extraout_RDX_01;
      }
      else {
        l = (Compound *)this->tail;
        if (this_00->body != (Goal *)0x0) {
          dst = (char *)l;
          l = (Compound *)append(this_00->body,(Goal *)l);
        }
        if (l == (Compound *)0x0) {
          VarMapping::show_answer(vars);
          src = extraout_RDX_02;
        }
        else {
          dst = (char *)prog;
          solve((Goal *)l,prog,level + 1,vars);
          src = extraout_RDX_00;
        }
      }
      for (; Trace::history != pTVar1; Trace::history = Trace::history->tail) {
        Trace::history->head->instance = &Trace::history->head->super_Term;
      }
      pPVar4 = pPVar4->tail;
    } while (pPVar4 != (Program *)0x0);
  }
  return;
}

Assistant:

void Goal::solve(Program *prog, int level, VarMapping *vars)
{
    indent(level);
    std::cout << "solve@" << level << ": ";
    this->print();
    std::cout << "\n";

    //
    // Iterate over the clauses of the program.
    //
    for (Program *iter = prog; iter; iter = iter->tail) {
        Trace *tr = Trace::Note();
        Clause *cl = iter->head->copy();
        Trace::Undo(tr);

        indent(level);
        std::cout << "  try:";
        cl->print();
        std::cout << "\n";

        // Match the goal to the clause head.
        if (head->unify(cl->head)) {

            // Matched: extend the goal with the clause body and solve it,
            // with the level incremented.
            Goal *gdash = cl->body ? cl->body->append(tail) : tail;
            if (gdash)
                gdash->solve(prog, level + 1, vars);
            else
                vars->show_answer();
        } else {
            indent(level);
            std::cout << "  nomatch.\n";
        }

        // Reset the variables bound at this iteration.
        Trace::Undo(tr);
    }
}